

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_metadata
          (ConcurrentDatabase *this,uint8_t **data,size_t *size)

{
  uint8_t *puVar1;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ResourceTag local_4c;
  ResourceTag tag;
  uint i;
  size_t offset;
  ExportedMetadataHeader *header;
  size_t required;
  size_t total_hashes;
  size_t *size_local;
  uint8_t **data_local;
  ConcurrentDatabase *this_local;
  
  sVar3 = get_total_num_hashes(this);
  uVar4 = sVar3 * 8 + 0xb0;
  if (*size < uVar4) {
    this_local._7_1_ = false;
  }
  else {
    puVar1 = *data;
    puVar1[0] = 'S';
    puVar1[1] = '\x11';
    puVar1[2] = 'Q';
    puVar1[3] = '\x05';
    puVar1[4] = '_';
    puVar1[5] = '\v';
    puVar1[6] = 0xb1;
    puVar1[7] = '\0';
    *(ulong *)(puVar1 + 8) = uVar4;
    _tag = 0xb0;
    for (local_4c = RESOURCE_APPLICATION_INFO; local_4c < RESOURCE_COUNT;
        local_4c = local_4c + RESOURCE_SAMPLER) {
      *(long *)(puVar1 + (ulong)local_4c * 0x10 + 0x10) = _tag;
      bVar2 = write_exported_concurrent_hashes
                        (this,local_4c,(ExportedMetadataConcurrentPrimedBlock *)(*data + _tag),
                         (uint64_t *)(puVar1 + (ulong)local_4c * 0x10 + 0x18));
      if (!bVar2) {
        return false;
      }
      _tag = *(long *)(puVar1 + (ulong)local_4c * 0x10 + 0x18) * 8 + _tag;
    }
    *data = *data + uVar4;
    *size = *size - uVar4;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool write_exported_concurrent_metadata(uint8_t *&data, size_t &size) const
	{
		size_t total_hashes = get_total_num_hashes();
		size_t required = sizeof(ExportedMetadataHeader) + total_hashes * sizeof(ExportedMetadataConcurrentPrimedBlock);
		if (size < required)
			return false;

		auto *header = reinterpret_cast<ExportedMetadataHeader *>(data);
		header->magic = ExportedMetadataMagicConcurrent;
		header->size = required;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = ResourceTag(i);
			header->lists[i].offset = offset;
			if (!write_exported_concurrent_hashes(tag, reinterpret_cast<ExportedMetadataConcurrentPrimedBlock *>(data + offset),
			                                      header->lists[i].count))
			{
				return false;
			}
			offset += header->lists[i].count * sizeof(ExportedMetadataConcurrentPrimedBlock);
		}

		data += required;
		size -= required;
		return true;
	}